

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall ycqian::thread_pool::thread_pool(thread_pool *this,size_t size)

{
  type local_38;
  thread local_28;
  ulong local_20;
  size_t i;
  size_t size_local;
  thread_pool *this_local;
  
  i = size;
  size_local = (size_t)this;
  std::make_shared<ycqian::thread_pool::data>();
  for (local_20 = 0; local_20 < i; local_20 = local_20 + 1) {
    std::shared_ptr<ycqian::thread_pool::data>::shared_ptr(&local_38.data,&this->data_);
    std::thread::thread<ycqian::thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
              (&local_28,&local_38);
    std::thread::detach();
    std::thread::~thread(&local_28);
    thread_pool(unsigned_long)::{lambda()#1}::~thread_pool((_lambda___1_ *)&local_38);
  }
  return;
}

Assistant:

explicit thread_pool(size_t size) : data_(std::make_shared<data>()) {
            for (size_t i = 0; i < size; ++i) {
                std::thread([data = data_]{
                    std::unique_lock<std::mutex> lk(data->mutex);
                    for (;;) {
                        if (data->tasks.size()>0) {
                            auto current = data->tasks.front();
                            data->tasks.pop();
                            lk.unlock();
                            current();
                            lk.lock();
                        } else if (data->shutdown) {
                            break;
                        } else {
                            data->cv.wait(lk);
                        }
                    }
                }).detach();
            }
        }